

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilter_tests.cpp
# Opt level: O1

void __thiscall blockfilter_tests::blockfilter_type_names::test_method(blockfilter_type_names *this)

{
  bool bVar1;
  int iVar2;
  string *psVar3;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string file_02;
  const_string file_03;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  const_string msg_02;
  const_string msg_03;
  check_type cVar6;
  char *local_1a0;
  char *local_198;
  undefined1 *local_190;
  undefined1 *local_188;
  char *local_180;
  char *local_178;
  char local_169;
  undefined1 *local_168;
  undefined1 *local_160;
  char *local_158;
  char *local_150;
  char *local_148;
  char *local_140;
  undefined1 *local_138;
  undefined1 *local_130;
  char *local_128;
  char *local_120;
  BlockFilterType filter_type;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  assertion_result local_f0;
  char *local_d8;
  undefined1 *local_d0;
  undefined1 *local_c8;
  char *local_c0;
  char *local_b8;
  char *local_b0;
  lazy_ostream local_a8;
  undefined1 *local_98;
  assertion_result *local_90;
  string *local_88;
  char *local_80;
  char *local_78;
  char *local_70;
  element_type *local_68;
  shared_count sStack_60;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_b8 = "";
  local_d0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_c8 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0xb5;
  file.m_begin = (iterator)&local_c0;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_d0,msg);
  local_f0.m_message.px = (element_type *)((ulong)local_f0.m_message.px & 0xffffffffffffff00);
  local_f0._0_8_ = &PTR__lazy_ostream_013abb30;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  psVar3 = BlockFilterTypeName_abi_cxx11_(BASIC);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (psVar3,"basic");
  local_68 = (element_type *)0x0;
  sStack_60.pi_ = (sp_counted_base *)0x0;
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_78 = "";
  local_48._8_8_ = &local_88;
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_90 = (assertion_result *)&local_b0;
  local_b0 = "basic";
  local_a8.m_empty = false;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ac0b0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_88 = psVar3;
  local_70._0_1_ = (class_property<bool>)(class_property<bool>)(iVar2 == 0);
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_70,(lazy_ostream *)&local_f0,1,2,REQUIRE,0xe64352,
             (size_t)&local_80,0xb5,local_58,"\"basic\"",&local_a8);
  boost::detail::shared_count::~shared_count(&sStack_60);
  local_100 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0xb6;
  file_00.m_begin = (iterator)&local_100;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_110,
             msg_00);
  local_f0.m_message.px = (element_type *)((ulong)local_f0.m_message.px & 0xffffffffffffff00);
  local_f0._0_8_ = &PTR__lazy_ostream_013abb30;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  psVar3 = BlockFilterTypeName_abi_cxx11_(INVALID);
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (psVar3,"");
  local_70 = (char *)CONCAT71(local_70._1_7_,iVar2 == 0);
  local_68 = (element_type *)0x0;
  sStack_60.pi_ = (sp_counted_base *)0x0;
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_78 = "";
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013abbf0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_88;
  local_b0 = "";
  local_a8.m_empty = false;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ac170;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = (assertion_result *)&local_b0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  local_88 = psVar3;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_70,(lazy_ostream *)&local_f0,1,2,REQUIRE,0xe6437e,
             (size_t)&local_80,0xb6,local_58,"\"\"",&local_a8);
  boost::detail::shared_count::~shared_count(&sStack_60);
  local_128 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_120 = "";
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  local_130 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0xb9;
  file_01.m_begin = (iterator)&local_128;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_138,
             msg_01);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"basic","");
  _cVar6 = 0x2f576a;
  bVar1 = BlockFilterTypeByName((string *)local_58,&filter_type);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)bVar1;
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_70 = "BlockFilterTypeByName(\"basic\", filter_type)";
  local_68 = (element_type *)0xe643e0;
  local_a8.m_empty = false;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_148 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_140 = "";
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x0;
  local_90 = (assertion_result *)&local_70;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_a8,1,0,WARN,_cVar6,(size_t)&local_148,0xb9);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  local_158 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_150 = "";
  local_168 = &boost::unit_test::basic_cstring<char_const>::null;
  local_160 = &boost::unit_test::basic_cstring<char_const>::null;
  file_02.m_end = (iterator)0xba;
  file_02.m_begin = (iterator)&local_158;
  msg_02.m_end = pvVar5;
  msg_02.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_02,(size_t)&local_168,
             msg_02);
  local_f0.m_message.px = (element_type *)((ulong)local_f0.m_message.px & 0xffffffffffffff00);
  local_f0._0_8_ = &PTR__lazy_ostream_013abb30;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)boost::unit_test::lazy_ostream::inst;
  local_d8 = "";
  local_b0 = &local_169;
  local_169 = '\0';
  local_70 = (char *)CONCAT71(local_70._1_7_,filter_type == BASIC);
  local_68 = (element_type *)0x0;
  sStack_60.pi_ = (sp_counted_base *)0x0;
  local_80 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_78 = "";
  local_88 = (string *)&filter_type;
  local_58[8] = 0;
  local_58._0_8_ = &PTR__lazy_ostream_013ac9a0;
  local_48._M_allocated_capacity = (size_type)boost::unit_test::lazy_ostream::inst;
  local_48._8_8_ = &local_88;
  local_a8.m_empty = false;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013ac9a0;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_90 = (assertion_result *)&local_b0;
  pvVar4 = (iterator)0x1;
  pvVar5 = (iterator)0x2;
  boost::test_tools::tt_detail::report_assertion
            ((assertion_result *)&local_70,(lazy_ostream *)&local_f0,1,2,REQUIRE,0xe64418,
             (size_t)&local_80,0xba,local_58,"BlockFilterType::BASIC",&local_a8);
  boost::detail::shared_count::~shared_count(&sStack_60);
  local_180 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_178 = "";
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  local_188 = &boost::unit_test::basic_cstring<char_const>::null;
  file_03.m_end = (iterator)0xbc;
  file_03.m_begin = (iterator)&local_180;
  msg_03.m_end = pvVar5;
  msg_03.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_03,(size_t)&local_190,
             msg_03);
  local_58._0_8_ = &local_48;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"unknown","");
  _cVar6 = 0x2f59c4;
  bVar1 = BlockFilterTypeByName((string *)local_58,&filter_type);
  local_f0.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(readonly_property<bool>)!bVar1;
  local_f0.m_message.px = (element_type *)0x0;
  local_f0.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_70 = "!BlockFilterTypeByName(\"unknown\", filter_type)";
  local_68 = (element_type *)0xe6440f;
  local_a8.m_empty = false;
  local_a8._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_013abc70;
  local_98 = boost::unit_test::lazy_ostream::inst;
  local_1a0 = 
  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/blockfilter_tests.cpp"
  ;
  local_198 = "";
  local_90 = (assertion_result *)&local_70;
  boost::test_tools::tt_detail::report_assertion
            (&local_f0,&local_a8,1,0,WARN,_cVar6,(size_t)&local_1a0,0xbc);
  boost::detail::shared_count::~shared_count(&local_f0.m_message.pn);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,(ulong)(local_48._M_allocated_capacity + 1));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(blockfilter_type_names)
{
    BOOST_CHECK_EQUAL(BlockFilterTypeName(BlockFilterType::BASIC), "basic");
    BOOST_CHECK_EQUAL(BlockFilterTypeName(static_cast<BlockFilterType>(255)), "");

    BlockFilterType filter_type;
    BOOST_CHECK(BlockFilterTypeByName("basic", filter_type));
    BOOST_CHECK_EQUAL(filter_type, BlockFilterType::BASIC);

    BOOST_CHECK(!BlockFilterTypeByName("unknown", filter_type));
}